

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-timeout.c
# Opt level: O2

int run_test_tcp_connect_timeout(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_30;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("8.8.8.8",9999,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,0x32,0);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(puVar2,&conn);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_connect(&connect_req,&conn,(sockaddr *)&addr,connect_cb);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              uv_walk(puVar2,close_walk_cb,(void *)0x0);
              uv_run(puVar2,UV_RUN_DEFAULT);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar3 = "0 == uv_loop_close(uv_default_loop())";
              uStack_30 = 0x59;
            }
            else {
              pcVar3 = "r == 0";
              uStack_30 = 0x57;
            }
          }
          else {
            if (iVar1 == -0x65) {
              fprintf(_stderr,"%s\n","Network unreachable.");
              fflush(_stderr);
              return 1;
            }
            pcVar3 = "r == 0";
            uStack_30 = 0x54;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_30 = 0x4c;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_30 = 0x49;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_30 = 0x46;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"8.8.8.8\", 9999, &addr)";
    uStack_30 = 0x43;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect-timeout.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_connect_timeout) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("8.8.8.8", 9999, &addr));

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}